

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i a;
  __m256i alVar23;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  uint uVar35;
  int iVar36;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  __m256i *ptr_06;
  __m256i *ptr_07;
  __m256i *ptr_08;
  __m256i *ptr_09;
  __m256i *ptr_10;
  __m256i *ptr_11;
  __m256i *ptr_12;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  int32_t temp;
  int32_t column_len;
  int16_t *l;
  int16_t *s;
  int16_t *m;
  int16_t *t;
  __m256i vCompare;
  __m256i cond_max;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case0;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vMaxHUnit;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m256i vOne;
  __m256i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  undefined1 in_stack_ffffffffffffd420 [16];
  size_t in_stack_ffffffffffffd430;
  undefined4 in_stack_ffffffffffffd438;
  undefined2 in_stack_ffffffffffffd43c;
  undefined2 uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  __m256i *local_2ba0;
  __m256i *local_2b98;
  __m256i *in_stack_ffffffffffffd470;
  __m256i *palVar46;
  __m256i *local_2b88;
  long lStack_2b68;
  __m256i local_2960;
  __m256i local_2940;
  __m256i local_2920;
  __m256i local_2900;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  longlong local_2720;
  longlong lStack_2718;
  longlong lStack_2710;
  longlong lStack_2708;
  longlong local_2700;
  longlong lStack_26f8;
  longlong lStack_26f0;
  longlong lStack_26e8;
  longlong local_26e0;
  longlong lStack_26d8;
  longlong lStack_26d0;
  longlong lStack_26c8;
  longlong local_2680;
  longlong lStack_2678;
  longlong lStack_2670;
  longlong lStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_25c0 [32];
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  short local_2468;
  short local_2466;
  short local_2464;
  ushort local_2462;
  ushort local_2320;
  int local_230c;
  int local_2308;
  int local_2304;
  uint local_2300;
  ushort local_22fc;
  ushort local_22f8;
  parasail_result_t *local_22e0;
  ulong uStack_22b8;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_scan_profile_avx2_256_16","profile");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_scan_profile_avx2_256_16",
            "profile->profile16.score");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_scan_profile_avx2_256_16",
            "profile->matrix");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_scan_profile_avx2_256_16",
            "profile->s1Len");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_scan_profile_avx2_256_16","s2");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_scan_profile_avx2_256_16","s2Len");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_scan_profile_avx2_256_16","open");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_scan_profile_avx2_256_16","gap");
    local_22e0 = (parasail_result_t *)0x0;
  }
  else {
    local_230c = 0;
    local_2308 = *(int *)(in_RDI + 8);
    lVar3 = *(long *)(in_RDI + 0x10);
    uVar35 = (local_2308 + 0xf) / 0x10;
    lVar4 = *(long *)(in_RDI + 0x30);
    lVar5 = *(long *)(in_RDI + 0x38);
    lVar6 = *(long *)(in_RDI + 0x40);
    local_22f8 = (ushort)in_ECX;
    auVar7 = vpinsrw_avx(ZEXT216(local_22f8),in_ECX & 0xffff,1);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,2);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,3);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,4);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,5);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar7,in_ECX & 0xffff,7);
    auVar39 = vpinsrw_avx(ZEXT216(local_22f8),in_ECX & 0xffff,1);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,2);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,3);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,4);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,5);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,6);
    auVar39 = vpinsrw_avx(auVar39,in_ECX & 0xffff,7);
    uStack_330 = auVar39._0_8_;
    uStack_328 = auVar39._8_8_;
    local_22fc = (ushort)in_R8D;
    auVar39 = vpinsrw_avx(ZEXT216(local_22fc),in_R8D & 0xffff,1);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,2);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,3);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,4);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,5);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,6);
    auVar39 = vpinsrw_avx(auVar39,in_R8D & 0xffff,7);
    auVar37 = vpinsrw_avx(ZEXT216(local_22fc),in_R8D & 0xffff,1);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,2);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,3);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,4);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,5);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,6);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,7);
    auVar37 = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar37;
    auVar39 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
    uStack_2f0 = auVar39._0_8_;
    uStack_2e8 = auVar39._8_8_;
    if ((int)-in_ECX < *(int *)(lVar3 + 0x20)) {
      iVar36 = in_ECX - 0x8000;
    }
    else {
      iVar36 = -0x8000 - *(int *)(lVar3 + 0x20);
    }
    local_2462 = (short)iVar36 + 1;
    uVar31 = ((ushort)*(undefined4 *)(lVar3 + 0x1c) ^ 0x7fff) - 1;
    uStack_22b8 = SUB328(ZEXT832(0),4);
    uVar42 = 1;
    auVar39 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar39 = vpinsrw_avx(auVar39,1,2);
    auVar39 = vpinsrw_avx(auVar39,1,3);
    auVar39 = vpinsrw_avx(auVar39,1,4);
    auVar39 = vpinsrw_avx(auVar39,1,5);
    auVar39 = vpinsrw_avx(auVar39,1,6);
    auVar39 = vpinsrw_avx(auVar39,1,7);
    auVar8 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar8 = vpinsrw_avx(auVar8,1,2);
    auVar8 = vpinsrw_avx(auVar8,1,3);
    auVar8 = vpinsrw_avx(auVar8,1,4);
    auVar8 = vpinsrw_avx(auVar8,1,5);
    auVar8 = vpinsrw_avx(auVar8,1,6);
    auVar8 = vpinsrw_avx(auVar8,1,7);
    uStack_2b0 = auVar8._0_8_;
    uStack_2a8 = auVar8._8_8_;
    local_2464 = 0;
    local_2466 = 0;
    local_2468 = 0;
    auVar8 = vpinsrw_avx(ZEXT216(local_2462),(uint)local_2462,1);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,2);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,3);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,4);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,5);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,6);
    auVar8 = vpinsrw_avx(auVar8,(uint)local_2462,7);
    auVar40 = vpinsrw_avx(ZEXT216(local_2462),(uint)local_2462,1);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,2);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,3);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,4);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,5);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,6);
    auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,7);
    uStack_270 = auVar40._0_8_;
    uStack_268 = auVar40._8_8_;
    auVar9 = vpinsrw_avx(ZEXT216(uVar31),(uint)uVar31,1);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,2);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,3);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,4);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,5);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,6);
    auVar9 = vpinsrw_avx(auVar9,(uint)uVar31,7);
    auVar38 = vpinsrw_avx(ZEXT216(uVar31),(uint)uVar31,1);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,2);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,3);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,4);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,5);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,6);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar31,7);
    uStack_230 = auVar38._0_8_;
    uStack_228 = auVar38._8_8_;
    local_24e0._16_8_ = uStack_230;
    local_24e0._0_16_ = auVar9;
    local_24e0._24_8_ = uStack_228;
    local_2500._16_8_ = uStack_270;
    local_2500._0_16_ = auVar8;
    local_2500._24_8_ = uStack_268;
    local_2520._16_8_ = uStack_270;
    local_2520._0_16_ = auVar8;
    local_2520._24_8_ = uStack_268;
    local_2540._16_8_ = uStack_270;
    local_2540._0_16_ = auVar8;
    local_2540._24_8_ = uStack_268;
    local_2560._16_8_ = uStack_270;
    local_2560._0_16_ = auVar8;
    local_2560._24_8_ = uStack_268;
    local_2580._16_8_ = uStack_270;
    local_2580._0_16_ = auVar8;
    local_2580._24_8_ = uStack_268;
    local_2320 = (ushort)uVar35;
    auVar38 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,2);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,3);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,4);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,5);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,6);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,7);
    auVar10 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,2);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,3);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,4);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,5);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,6);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,7);
    auVar21._16_16_ = auVar10;
    auVar21._0_16_ = auVar38;
    auVar38 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,2);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,3);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,4);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,5);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,6);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,7);
    auVar10 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,2);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,3);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,4);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,5);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,6);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,7);
    auVar20._16_16_ = auVar10;
    auVar20._0_16_ = auVar38;
    auVar38 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,2);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,3);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,4);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,5);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,6);
    auVar38 = vpinsrw_avx(auVar38,uVar35 & 0xffff,7);
    auVar10 = vpinsrw_avx(ZEXT216(local_2320),uVar35 & 0xffff,1);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,2);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,3);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,4);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,5);
    auVar10 = vpinsrw_avx(auVar10,uVar35 & 0xffff,6);
    vpinsrw_avx(auVar10,uVar35 & 0xffff,7);
    auVar20 = vperm2i128_avx2(ZEXT1632(auVar38),auVar20,0x28);
    auVar12 = vpalignr_avx2(auVar21,auVar20,0xe);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uStack_22b8;
    local_25c0._0_16_ = auVar38 << 0x40;
    auVar38 = local_25c0._0_16_;
    local_25c0 = ZEXT832(uStack_22b8) << 0x40;
    auVar38 = vpinsrw_avx(auVar38,(uint)local_2462,0);
    auVar20 = vblendps_avx(local_25c0,ZEXT1632(auVar38),0xf);
    uVar32 = -local_2320 * local_22fc;
    auVar38 = vpinsrw_avx(ZEXT216(uVar32),(uint)uVar32,1);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,2);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,3);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,4);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,5);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,6);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar32,7);
    auVar10 = vpinsrw_avx(ZEXT216(uVar32),(uint)uVar32,1);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,2);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,3);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,4);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,5);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,6);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar32,7);
    auVar22._16_16_ = auVar10;
    auVar22._0_16_ = auVar38;
    uVar33 = -local_2320 * local_22fc;
    auVar38 = vpinsrw_avx(ZEXT216(uVar33),(uint)uVar33,1);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,2);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,3);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,4);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,5);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,6);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar33,7);
    auVar10 = vpinsrw_avx(ZEXT216(uVar33),(uint)uVar33,1);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,2);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,3);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,4);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,5);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,6);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar33,7);
    auVar18._16_16_ = auVar10;
    auVar18._0_16_ = auVar38;
    uVar34 = -local_2320 * local_22fc;
    auVar38 = vpinsrw_avx(ZEXT216(uVar34),(uint)uVar34,1);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,2);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,3);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,4);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,5);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,6);
    auVar38 = vpinsrw_avx(auVar38,(uint)uVar34,7);
    auVar10 = vpinsrw_avx(ZEXT216(uVar34),(uint)uVar34,1);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar34,2);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar34,3);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar34,4);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar34,5);
    auVar10 = vpinsrw_avx(auVar10,(uint)uVar34,6);
    vpinsrw_avx(auVar10,(uint)uVar34,7);
    auVar21 = vperm2i128_avx2(ZEXT1632(auVar38),auVar18,0x28);
    auVar21 = vpalignr_avx2(auVar22,auVar21,0xe);
    auVar21 = vpaddsw_avx2(auVar20,auVar21);
    uVar43 = local_2462;
    uVar44 = local_2320;
    uVar45 = local_2320;
    local_22e0 = parasail_result_new_stats();
    if (local_22e0 == (parasail_result_t *)0x0) {
      local_22e0 = (parasail_result_t *)0x0;
    }
    else {
      local_22e0->flag = local_22e0->flag | 0x10210404;
      ptr = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_00 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_01 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_02 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_03 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_04 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_05 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_06 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_07 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_08 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_09 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_10 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_11 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      ptr_12 = parasail_memalign___m256i(0x20,(long)(int)uVar35);
      if (ptr == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_03 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_04 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_05 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_06 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_07 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_08 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_09 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_10 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_11 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else if (ptr_12 == (__m256i *)0x0) {
        local_22e0 = (parasail_result_t *)0x0;
      }
      else {
        alVar23[0]._4_2_ = in_stack_ffffffffffffd43c;
        alVar23[0]._0_4_ = in_stack_ffffffffffffd438;
        alVar23[0]._6_2_ = uVar42;
        alVar23[1]._0_2_ = uVar43;
        alVar23[1]._2_2_ = uVar31;
        alVar23[1]._4_2_ = local_2320;
        alVar23[1]._6_2_ = uVar44;
        alVar23[2]._0_2_ = uVar45;
        alVar23[2]._2_2_ = uVar32;
        alVar23[2]._4_2_ = uVar33;
        alVar23[2]._6_2_ = uVar34;
        alVar23[3]._0_4_ = iVar36;
        alVar23[3]._4_2_ = local_22f8;
        alVar23[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar23,in_stack_ffffffffffffd430);
        alVar24[0]._4_2_ = in_stack_ffffffffffffd43c;
        alVar24[0]._0_4_ = in_stack_ffffffffffffd438;
        alVar24[0]._6_2_ = uVar42;
        alVar24[1]._0_2_ = uVar43;
        alVar24[1]._2_2_ = uVar31;
        alVar24[1]._4_2_ = local_2320;
        alVar24[1]._6_2_ = uVar44;
        alVar24[2]._0_2_ = uVar45;
        alVar24[2]._2_2_ = uVar32;
        alVar24[2]._4_2_ = uVar33;
        alVar24[2]._6_2_ = uVar34;
        alVar24[3]._0_4_ = iVar36;
        alVar24[3]._4_2_ = local_22f8;
        alVar24[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar24,in_stack_ffffffffffffd430);
        alVar25[0]._4_2_ = in_stack_ffffffffffffd43c;
        alVar25[0]._0_4_ = in_stack_ffffffffffffd438;
        alVar25[0]._6_2_ = uVar42;
        alVar25[1]._0_2_ = uVar43;
        alVar25[1]._2_2_ = uVar31;
        alVar25[1]._4_2_ = local_2320;
        alVar25[1]._6_2_ = uVar44;
        alVar25[2]._0_2_ = uVar45;
        alVar25[2]._2_2_ = uVar32;
        alVar25[2]._4_2_ = uVar33;
        alVar25[2]._6_2_ = uVar34;
        alVar25[3]._0_4_ = iVar36;
        alVar25[3]._4_2_ = local_22f8;
        alVar25[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar25,in_stack_ffffffffffffd430);
        alVar26[0]._4_2_ = in_stack_ffffffffffffd43c;
        alVar26[0]._0_4_ = in_stack_ffffffffffffd438;
        alVar26[0]._6_2_ = uVar42;
        alVar26[1]._0_2_ = uVar43;
        alVar26[1]._2_2_ = uVar31;
        alVar26[1]._4_2_ = local_2320;
        alVar26[1]._6_2_ = uVar44;
        alVar26[2]._0_2_ = uVar45;
        alVar26[2]._2_2_ = uVar32;
        alVar26[2]._4_2_ = uVar33;
        alVar26[2]._6_2_ = uVar34;
        alVar26[3]._0_4_ = iVar36;
        alVar26[3]._4_2_ = local_22f8;
        alVar26[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar26,in_stack_ffffffffffffd430);
        c[0]._4_2_ = in_stack_ffffffffffffd43c;
        c[0]._0_4_ = in_stack_ffffffffffffd438;
        c[0]._6_2_ = uVar42;
        c[1]._0_2_ = uVar43;
        c[1]._2_2_ = uVar31;
        c[1]._4_2_ = local_2320;
        c[1]._6_2_ = uVar44;
        c[2]._0_2_ = uVar45;
        c[2]._2_2_ = uVar32;
        c[2]._4_2_ = uVar33;
        c[2]._6_2_ = uVar34;
        c[3]._0_4_ = iVar36;
        c[3]._4_2_ = local_22f8;
        c[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c,in_stack_ffffffffffffd430);
        c_00[0]._4_2_ = in_stack_ffffffffffffd43c;
        c_00[0]._0_4_ = in_stack_ffffffffffffd438;
        c_00[0]._6_2_ = uVar42;
        c_00[1]._0_2_ = uVar43;
        c_00[1]._2_2_ = uVar31;
        c_00[1]._4_2_ = local_2320;
        c_00[1]._6_2_ = uVar44;
        c_00[2]._0_2_ = uVar45;
        c_00[2]._2_2_ = uVar32;
        c_00[2]._4_2_ = uVar33;
        c_00[2]._6_2_ = uVar34;
        c_00[3]._0_4_ = iVar36;
        c_00[3]._4_2_ = local_22f8;
        c_00[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_00,in_stack_ffffffffffffd430);
        c_01[0]._4_2_ = in_stack_ffffffffffffd43c;
        c_01[0]._0_4_ = in_stack_ffffffffffffd438;
        c_01[0]._6_2_ = uVar42;
        c_01[1]._0_2_ = uVar43;
        c_01[1]._2_2_ = uVar31;
        c_01[1]._4_2_ = local_2320;
        c_01[1]._6_2_ = uVar44;
        c_01[2]._0_2_ = uVar45;
        c_01[2]._2_2_ = uVar32;
        c_01[2]._4_2_ = uVar33;
        c_01[2]._6_2_ = uVar34;
        c_01[3]._0_4_ = iVar36;
        c_01[3]._4_2_ = local_22f8;
        c_01[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_01,in_stack_ffffffffffffd430);
        c_02[0]._4_2_ = in_stack_ffffffffffffd43c;
        c_02[0]._0_4_ = in_stack_ffffffffffffd438;
        c_02[0]._6_2_ = uVar42;
        c_02[1]._0_2_ = uVar43;
        c_02[1]._2_2_ = uVar31;
        c_02[1]._4_2_ = local_2320;
        c_02[1]._6_2_ = uVar44;
        c_02[2]._0_2_ = uVar45;
        c_02[2]._2_2_ = uVar32;
        c_02[2]._4_2_ = uVar33;
        c_02[2]._6_2_ = uVar34;
        c_02[3]._0_4_ = iVar36;
        c_02[3]._4_2_ = local_22f8;
        c_02[3]._6_2_ = local_22fc;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_02,in_stack_ffffffffffffd430);
        auVar19._16_8_ = uStack_330;
        auVar19._0_16_ = auVar7;
        auVar19._24_8_ = uStack_328;
        local_2640 = vpsubsw_avx2(ZEXT832(uStack_22b8) << 0x40,auVar19);
        local_2660._16_8_ = uStack_2b0;
        local_2660._0_16_ = auVar39;
        local_2660._24_8_ = uStack_2a8;
        local_2300 = uVar35;
        while( true ) {
          local_2300 = local_2300 - 1;
          auVar41 = ZEXT3264(auVar19);
          if ((int)local_2300 < 0) break;
          palVar46 = ptr_11 + (int)local_2300;
          (*palVar46)[0] = local_2640._0_8_;
          (*palVar46)[1] = local_2640._8_8_;
          (*palVar46)[2] = local_2640._16_8_;
          (*palVar46)[3] = local_2640._24_8_;
          palVar46 = ptr_12 + (int)local_2300;
          (*palVar46)[0] = local_2660._0_8_;
          (*palVar46)[1] = local_2660._8_8_;
          (*palVar46)[2] = local_2660._16_8_;
          (*palVar46)[3] = local_2660._24_8_;
          auVar15._16_8_ = uStack_2f0;
          auVar15._0_16_ = auVar37;
          auVar15._24_8_ = uStack_2e8;
          local_2640 = vpsubsw_avx2(local_2640,auVar15);
          auVar19._16_8_ = uStack_2b0;
          auVar19._0_16_ = auVar39;
          auVar19._24_8_ = uStack_2a8;
          local_2660 = vpaddsw_avx2(local_2660,auVar19);
        }
        local_2304 = 0;
        auVar38 = auVar8;
        while( true ) {
          uStack_2588 = auVar40._8_8_;
          uStack_2590 = auVar40._0_8_;
          if (in_EDX <= local_2304) break;
          auVar22 = vperm2i128_avx2(auVar41._0_32_,(undefined1  [32])ptr_03[(int)(uVar35 - 1)],0x28)
          ;
          local_2900 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_03[(int)(uVar35 - 1)],auVar22,
                                              0xe);
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])ptr_04[(int)(uVar35 - 1)],0x28);
          local_2920 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_04[(int)(uVar35 - 1)],auVar22,
                                              0xe);
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])ptr_05[(int)(uVar35 - 1)],0x28);
          local_2940 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_05[(int)(uVar35 - 1)],auVar22,
                                              0xe);
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])ptr_06[(int)(uVar35 - 1)],0x28);
          local_2960 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_06[(int)(uVar35 - 1)],auVar22,
                                              0xe);
          iVar36 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)*(byte *)(in_RSI + local_2304) * 4);
          iVar1 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)*(byte *)(in_RSI + local_2304) * 4);
          iVar2 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)*(byte *)(in_RSI + local_2304) * 4);
          local_2740 = ZEXT832(uStack_22b8) << 0x40;
          local_27c0._16_8_ = uStack_270;
          local_27c0._0_16_ = auVar8;
          local_27c0._24_8_ = uStack_268;
          local_2820 = ZEXT832(uStack_22b8) << 0x40;
          local_2840 = ZEXT832(uStack_22b8) << 0x40;
          local_2860 = ZEXT832(uStack_22b8) << 0x40;
          for (local_2300 = 0; (int)local_2300 < (int)uVar35; local_2300 = local_2300 + 1) {
            alVar23 = ptr_03[(int)local_2300];
            alVar24 = ptr_04[(int)local_2300];
            alVar25 = ptr_05[(int)local_2300];
            alVar26 = ptr_06[(int)local_2300];
            auVar14._16_8_ = uStack_330;
            auVar14._0_16_ = auVar7;
            auVar14._24_8_ = uStack_328;
            auVar18 = vpsubsw_avx2((undefined1  [32])ptr_03[(int)local_2300],auVar14);
            auVar13._16_8_ = uStack_2f0;
            auVar13._0_16_ = auVar37;
            auVar13._24_8_ = uStack_2e8;
            auVar19 = vpsubsw_avx2((undefined1  [32])ptr[(int)local_2300],auVar13);
            auVar22 = vpcmpgtw_avx2(auVar18,auVar19);
            auVar17 = vpmaxsw_avx2(auVar18,auVar19);
            auVar13 = vpblendvb_avx2((undefined1  [32])ptr_00[(int)local_2300],
                                     (undefined1  [32])ptr_04[(int)local_2300],auVar22);
            auVar14 = vpblendvb_avx2((undefined1  [32])ptr_01[(int)local_2300],
                                     (undefined1  [32])ptr_05[(int)local_2300],auVar22);
            auVar22 = vpblendvb_avx2((undefined1  [32])ptr_02[(int)local_2300],
                                     (undefined1  [32])ptr_06[(int)local_2300],auVar22);
            auVar16._16_8_ = uStack_2b0;
            auVar16._0_16_ = auVar39;
            auVar16._24_8_ = uStack_2a8;
            auVar22 = vpaddsw_avx2(auVar22,auVar16);
            auVar18 = vpaddsw_avx2(local_2740,(undefined1  [32])ptr_11[(int)local_2300]);
            auVar15 = vpcmpgtw_avx2(local_27c0,auVar18);
            auVar19 = vpcmpeqw_avx2(local_27c0,auVar18);
            auVar19 = vpor_avx2(auVar15,auVar19);
            local_27c0 = vpmaxsw_avx2(local_27c0,auVar18);
            local_2820 = vpblendvb_avx2(local_2760,local_2820,auVar19);
            local_2840 = vpblendvb_avx2(local_2780,local_2840,auVar19);
            auVar18 = vpaddsw_avx2(local_27a0,(undefined1  [32])ptr_12[(int)local_2300]);
            local_2860 = vpblendvb_avx2(auVar18,local_2860,auVar19);
            auVar18 = vpaddsw_avx2((undefined1  [32])local_2900,
                                   *(undefined1 (*) [32])
                                    (lVar4 + (long)(int)(iVar36 * uVar35) * 0x20 +
                                    (long)(int)local_2300 * 0x20));
            auVar19 = vpaddsw_avx2((undefined1  [32])local_2920,
                                   *(undefined1 (*) [32])
                                    (lVar5 + (long)(int)(iVar1 * uVar35) * 0x20 +
                                    (long)(int)local_2300 * 0x20));
            auVar15 = vpaddsw_avx2((undefined1  [32])local_2940,
                                   *(undefined1 (*) [32])
                                    (lVar6 + (long)(int)(iVar2 * uVar35) * 0x20 +
                                    (long)(int)local_2300 * 0x20));
            auVar11._16_8_ = uStack_2b0;
            auVar11._0_16_ = auVar39;
            auVar11._24_8_ = uStack_2a8;
            auVar11 = vpaddsw_avx2((undefined1  [32])local_2960,auVar11);
            local_2680 = auVar17._0_8_;
            lStack_2678 = auVar17._8_8_;
            lStack_2670 = auVar17._16_8_;
            lStack_2668 = auVar17._24_8_;
            local_2900[0] = auVar18._0_8_;
            local_2900[1] = auVar18._8_8_;
            local_2900[2] = auVar18._16_8_;
            local_2900[3] = auVar18._24_8_;
            auVar16 = vpcmpgtw_avx2(auVar17,auVar18);
            local_2740 = vpmaxsw_avx2(auVar17,auVar18);
            local_2920[0] = auVar19._0_8_;
            local_2920[1] = auVar19._8_8_;
            local_2920[2] = auVar19._16_8_;
            local_2920[3] = auVar19._24_8_;
            local_26e0 = auVar13._0_8_;
            lStack_26d8 = auVar13._8_8_;
            lStack_26d0 = auVar13._16_8_;
            lStack_26c8 = auVar13._24_8_;
            local_2760 = vpblendvb_avx2(auVar19,auVar13,auVar16);
            local_2940[0] = auVar15._0_8_;
            local_2940[1] = auVar15._8_8_;
            local_2940[2] = auVar15._16_8_;
            local_2940[3] = auVar15._24_8_;
            local_2700 = auVar14._0_8_;
            lStack_26f8 = auVar14._8_8_;
            lStack_26f0 = auVar14._16_8_;
            lStack_26e8 = auVar14._24_8_;
            local_2780 = vpblendvb_avx2(auVar15,auVar14,auVar16);
            local_2960[0] = auVar11._0_8_;
            local_2960[1] = auVar11._8_8_;
            local_2960[2] = auVar11._16_8_;
            local_2960[3] = auVar11._24_8_;
            local_2720 = auVar22._0_8_;
            lStack_2718 = auVar22._8_8_;
            lStack_2710 = auVar22._16_8_;
            lStack_2708 = auVar22._24_8_;
            local_27a0 = vpblendvb_avx2(auVar11,auVar22,auVar16);
            palVar46 = ptr + (int)local_2300;
            (*palVar46)[0] = local_2680;
            (*palVar46)[1] = lStack_2678;
            (*palVar46)[2] = lStack_2670;
            (*palVar46)[3] = lStack_2668;
            palVar46 = ptr_00 + (int)local_2300;
            (*palVar46)[0] = local_26e0;
            (*palVar46)[1] = lStack_26d8;
            (*palVar46)[2] = lStack_26d0;
            (*palVar46)[3] = lStack_26c8;
            palVar46 = ptr_01 + (int)local_2300;
            (*palVar46)[0] = local_2700;
            (*palVar46)[1] = lStack_26f8;
            (*palVar46)[2] = lStack_26f0;
            (*palVar46)[3] = lStack_26e8;
            palVar46 = ptr_02 + (int)local_2300;
            (*palVar46)[0] = local_2720;
            (*palVar46)[1] = lStack_2718;
            (*palVar46)[2] = lStack_2710;
            (*palVar46)[3] = lStack_2708;
            palVar46 = ptr_03 + (int)local_2300;
            (*palVar46)[0] = local_2900[0];
            (*palVar46)[1] = local_2900[1];
            (*palVar46)[2] = local_2900[2];
            (*palVar46)[3] = local_2900[3];
            palVar46 = ptr_04 + (int)local_2300;
            (*palVar46)[0] = local_2920[0];
            (*palVar46)[1] = local_2920[1];
            (*palVar46)[2] = local_2920[2];
            (*palVar46)[3] = local_2920[3];
            palVar46 = ptr_05 + (int)local_2300;
            (*palVar46)[0] = local_2940[0];
            (*palVar46)[1] = local_2940[1];
            (*palVar46)[2] = local_2940[2];
            (*palVar46)[3] = local_2940[3];
            palVar46 = ptr_06 + (int)local_2300;
            (*palVar46)[0] = local_2960[0];
            (*palVar46)[1] = local_2960[1];
            (*palVar46)[2] = local_2960[2];
            (*palVar46)[3] = local_2960[3];
            local_2960 = alVar26;
            local_2940 = alVar25;
            local_2920 = alVar24;
            local_2900 = alVar23;
          }
          auVar22 = vperm2i128_avx2(auVar22,local_2740,0x28);
          auVar18 = vpalignr_avx2(local_2740,auVar22,0xe);
          auVar22 = vperm2i128_avx2(auVar22,local_2760,0x28);
          local_2760 = vpalignr_avx2(local_2760,auVar22,0xe);
          auVar22 = vperm2i128_avx2(auVar22,local_2780,0x28);
          local_2780 = vpalignr_avx2(local_2780,auVar22,0xe);
          auVar22 = vperm2i128_avx2(auVar22,local_27a0,0x28);
          local_27a0 = vpalignr_avx2(local_27a0,auVar22,0xe);
          auVar22 = vpaddsw_avx2(auVar18,(undefined1  [32])*ptr_11);
          auVar15 = vpcmpgtw_avx2(auVar22,local_27c0);
          auVar19 = vpcmpeqw_avx2(auVar22,local_27c0);
          auVar19 = vpor_avx2(auVar15,auVar19);
          local_27c0 = vpmaxsw_avx2(local_27c0,auVar22);
          local_2820 = vpblendvb_avx2(local_2820,local_2760,auVar19);
          local_2840 = vpblendvb_avx2(local_2840,local_2780,auVar19);
          auVar22 = vpaddsw_avx2(local_27a0,(undefined1  [32])*ptr_12);
          local_2860 = vpblendvb_avx2(local_2860,auVar22,auVar19);
          for (local_2300 = 0; (int)local_2300 < 0xe; local_2300 = local_2300 + 1) {
            auVar19 = vperm2i128_avx2(auVar22,local_27c0,0x28);
            auVar22 = vpalignr_avx2(local_27c0,auVar19,0xe);
            auVar15 = vperm2i128_avx2(auVar19,local_2820,0x28);
            auVar19 = vpalignr_avx2(local_2820,auVar15,0xe);
            auVar11 = vperm2i128_avx2(auVar15,local_2840,0x28);
            auVar15 = vpalignr_avx2(local_2840,auVar11,0xe);
            auVar11 = vperm2i128_avx2(auVar11,local_2860,0x28);
            auVar11 = vpalignr_avx2(local_2860,auVar11,0xe);
            auVar22 = vpaddsw_avx2(auVar22,auVar21);
            auVar14 = vpcmpgtw_avx2(auVar22,local_27c0);
            auVar13 = vpcmpeqw_avx2(auVar22,local_27c0);
            auVar13 = vpor_avx2(auVar14,auVar13);
            local_27c0 = vpmaxsw_avx2(local_27c0,auVar22);
            local_2820 = vpblendvb_avx2(local_2820,auVar19,auVar13);
            local_2840 = vpblendvb_avx2(local_2840,auVar15,auVar13);
            auVar22 = vpaddsw_avx2(auVar11,auVar12);
            local_2860 = vpblendvb_avx2(local_2860,auVar22,auVar13);
          }
          auVar19 = vperm2i128_avx2(auVar22,local_27c0,0x28);
          auVar22 = vpalignr_avx2(local_27c0,auVar19,0xe);
          auVar19 = vperm2i128_avx2(auVar19,local_2820,0x28);
          local_2820 = vpalignr_avx2(local_2820,auVar19,0xe);
          auVar19 = vperm2i128_avx2(auVar19,local_2840,0x28);
          local_2840 = vpalignr_avx2(local_2840,auVar19,0xe);
          auVar19 = vperm2i128_avx2(auVar19,local_2860,0x28);
          local_2860 = vpalignr_avx2(local_2860,auVar19,0xe);
          local_27c0 = vpaddsw_avx2(auVar22,auVar20);
          auVar22 = vpcmpgtw_avx2(local_27c0,auVar18);
          local_2880 = vpmaxsw_avx2(local_27c0,auVar18);
          local_28a0 = vpblendvb_avx2(local_2760,local_2820,auVar22);
          local_28c0 = vpblendvb_avx2(local_2780,local_2840,auVar22);
          local_28e0 = vpblendvb_avx2(local_27a0,local_2860,auVar22);
          for (local_2300 = 0; (int)local_2300 < (int)uVar35; local_2300 = local_2300 + 1) {
            auVar28._16_8_ = uStack_330;
            auVar28._0_16_ = auVar7;
            auVar28._24_8_ = uStack_328;
            auVar22 = vpsubsw_avx2(local_2880,auVar28);
            auVar27._16_8_ = uStack_2f0;
            auVar27._0_16_ = auVar37;
            auVar27._24_8_ = uStack_2e8;
            auVar18 = vpsubsw_avx2(local_27c0,auVar27);
            local_27c0 = vpmaxsw_avx2(auVar22,auVar18);
            auVar22 = vpcmpgtw_avx2(auVar22,auVar18);
            local_2820 = vpblendvb_avx2(local_2820,local_28a0,auVar22);
            local_2840 = vpblendvb_avx2(local_2840,local_28c0,auVar22);
            auVar22 = vpblendvb_avx2(local_2860,local_28e0,auVar22);
            auVar17._16_8_ = uStack_2b0;
            auVar17._0_16_ = auVar39;
            auVar17._24_8_ = uStack_2a8;
            local_2860 = vpaddsw_avx2(auVar22,auVar17);
            auVar22 = vpmaxsw_avx2((undefined1  [32])ptr_03[(int)local_2300],
                                   (undefined1  [32])ptr[(int)local_2300]);
            auVar22 = vpmaxsw_avx2(auVar22,local_27c0);
            local_2880 = vpmaxsw_avx2(auVar22,ZEXT832(uStack_22b8) << 0x40);
            auVar18 = vpcmpeqw_avx2(local_2880,(undefined1  [32])ptr_03[(int)local_2300]);
            auVar19 = vpcmpeqw_avx2(local_2880,local_27c0);
            auVar15 = vpcmpeqw_avx2(local_2880,ZEXT832(uStack_22b8) << 0x40);
            auVar22 = vpblendvb_avx2((undefined1  [32])ptr_00[(int)local_2300],local_2820,auVar19);
            auVar22 = vpblendvb_avx2(auVar22,(undefined1  [32])ptr_04[(int)local_2300],auVar18);
            local_28a0 = vpblendvb_avx2(auVar22,ZEXT832(uStack_22b8) << 0x40,auVar15);
            auVar22 = vpblendvb_avx2((undefined1  [32])ptr_01[(int)local_2300],local_2840,auVar19);
            auVar22 = vpblendvb_avx2(auVar22,(undefined1  [32])ptr_05[(int)local_2300],auVar18);
            local_28c0 = vpblendvb_avx2(auVar22,ZEXT832(uStack_22b8) << 0x40,auVar15);
            auVar22 = vpblendvb_avx2((undefined1  [32])ptr_02[(int)local_2300],local_2860,auVar19);
            auVar22 = vpblendvb_avx2(auVar22,(undefined1  [32])ptr_06[(int)local_2300],auVar18);
            local_28e0 = vpblendvb_avx2(auVar22,ZEXT832(uStack_22b8) << 0x40,auVar15);
            palVar46 = ptr_03 + (int)local_2300;
            (*palVar46)[0] = local_2880._0_8_;
            (*palVar46)[1] = local_2880._8_8_;
            (*palVar46)[2] = local_2880._16_8_;
            (*palVar46)[3] = local_2880._24_8_;
            palVar46 = ptr_04 + (int)local_2300;
            (*palVar46)[0] = local_28a0._0_8_;
            (*palVar46)[1] = local_28a0._8_8_;
            (*palVar46)[2] = local_28a0._16_8_;
            (*palVar46)[3] = local_28a0._24_8_;
            palVar46 = ptr_05 + (int)local_2300;
            (*palVar46)[0] = local_28c0._0_8_;
            (*palVar46)[1] = local_28c0._8_8_;
            (*palVar46)[2] = local_28c0._16_8_;
            (*palVar46)[3] = local_28c0._24_8_;
            palVar46 = ptr_06 + (int)local_2300;
            (*palVar46)[0] = local_28e0._0_8_;
            (*palVar46)[1] = local_28e0._8_8_;
            (*palVar46)[2] = local_28e0._16_8_;
            (*palVar46)[3] = local_28e0._24_8_;
            local_24e0 = vpminsw_avx2(local_24e0,local_2880);
            auVar22 = vpmaxsw_avx2(local_2500,local_2880);
            auVar22 = vpmaxsw_avx2(auVar22,local_28a0);
            auVar22 = vpmaxsw_avx2(auVar22,local_28c0);
            local_2500 = vpmaxsw_avx2(auVar22,local_28e0);
            auVar22 = vpcmpgtw_avx2(local_2880,local_2520);
            local_2520 = vpmaxsw_avx2(local_2880,local_2520);
            local_2540 = vpblendvb_avx2(local_2540,local_28a0,auVar22);
            local_2560 = vpblendvb_avx2(local_2560,local_28c0,auVar22);
            local_2580 = vpblendvb_avx2(local_2580,local_28e0,auVar22);
          }
          auVar30._16_8_ = uStack_2590;
          auVar30._0_16_ = auVar38;
          auVar30._24_8_ = uStack_2588;
          auVar41 = ZEXT3264(auVar30);
          auVar22 = vpcmpgtw_avx2(local_2520,auVar30);
          lStack_2b68 = auVar22._24_8_;
          if ((((((((((((((((((((((((((((((((auVar22 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar22 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar22 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar22 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar22 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar22 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar22 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar22 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar22 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar22 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar22 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar22 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar22 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar22 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar22 >> 0x7f,0) != '\0') ||
                            (auVar22 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar22 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar22 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar22 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar22 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar22 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar22 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar22 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_2b68 < 0
             ) {
            a[1] = in_stack_ffffffffffffd420._0_8_;
            a[2] = in_stack_ffffffffffffd420._8_8_;
            a[0] = 0xbfeacd;
            a[3] = in_stack_ffffffffffffd430;
            local_2462 = _mm256_hmax_epi16_rpl(a);
            auVar40 = vpinsrw_avx(ZEXT216(local_2462),(uint)local_2462,1);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,2);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,3);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,4);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,5);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,6);
            auVar10 = vpinsrw_avx(auVar40,(uint)local_2462,7);
            auVar40 = vpinsrw_avx(ZEXT216(local_2462),(uint)local_2462,1);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,2);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,3);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,4);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,5);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,6);
            auVar40 = vpinsrw_avx(auVar40,(uint)local_2462,7);
            auVar38 = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar40;
            auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
            local_230c = local_2304;
            auVar41 = ZEXT1664(auVar10);
            memcpy(ptr_07,ptr_03,(long)(int)uVar35 << 5);
            memcpy(ptr_08,ptr_04,(long)(int)uVar35 << 5);
            memcpy(ptr_09,ptr_05,(long)(int)uVar35 << 5);
            memcpy(ptr_10,ptr_06,(long)(int)uVar35 << 5);
          }
          local_2304 = local_2304 + 1;
        }
        local_2ba0 = ptr_10;
        local_2b98 = ptr_09;
        palVar46 = ptr_08;
        local_2b88 = ptr_07;
        for (local_2300 = 0; (int)local_2300 < (int)(uVar35 * 0x10); local_2300 = local_2300 + 1) {
          if (((ushort)(*local_2b88)[0] == local_2462) &&
             (iVar36 = (int)local_2300 / 0x10 + ((int)local_2300 % 0x10) * uVar35,
             iVar36 < local_2308)) {
            local_2464 = (short)(*palVar46)[0];
            local_2466 = (short)(*local_2b98)[0];
            local_2468 = (short)(*local_2ba0)[0];
            local_2308 = iVar36;
          }
          local_2b88 = (__m256i *)((long)*local_2b88 + 2);
          palVar46 = (__m256i *)((long)*palVar46 + 2);
          local_2b98 = (__m256i *)((long)*local_2b98 + 2);
          local_2ba0 = (__m256i *)((long)*local_2ba0 + 2);
        }
        auVar29._16_8_ = uStack_270;
        auVar29._0_16_ = auVar8;
        auVar29._24_8_ = uStack_268;
        auVar20 = vpcmpgtw_avx2(auVar29,local_24e0);
        auVar12._16_8_ = uStack_230;
        auVar12._0_16_ = auVar9;
        auVar12._24_8_ = uStack_228;
        auVar21 = vpcmpgtw_avx2(local_2500,auVar12);
        auVar20 = vpor_avx2(auVar20,auVar21);
        if ((((((((((((((((((((((((((((((((auVar20 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar20 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar20 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar20 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar20 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar20 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar20 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar20 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar20 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar20 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar20 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar20 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar20 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar20 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar20 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar20 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar20 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar20 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar20 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar20 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar20 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar20[0x1f] < '\0') {
          local_22e0->flag = local_22e0->flag | 0x40;
          local_2462 = 0;
          local_2464 = 0;
          local_2466 = 0;
          local_2468 = 0;
          local_2308 = 0;
          local_230c = 0;
        }
        local_22e0->score = (int)(short)local_2462;
        local_22e0->end_query = local_2308;
        local_22e0->end_ref = local_230c;
        *(int *)(local_22e0->field_4).extra = (int)local_2464;
        ((local_22e0->field_4).stats)->similar = (int)local_2466;
        ((local_22e0->field_4).stats)->length = (int)local_2468;
        parasail_free(ptr_12);
        parasail_free(ptr_11);
        parasail_free(ptr_10);
        parasail_free(ptr_09);
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return local_22e0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            vH = _mm256_max_epi16(vH, vZero);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            case0 = _mm256_cmpeq_epi16(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}